

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationWindingTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::tessellation::anon_unknown_7::WindingTest::createInstance(WindingTest *this,Context *context)

{
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  WindingTestInstance *this_00;
  Context *context_local;
  WindingTest *this_local;
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,1);
  this_00 = (WindingTestInstance *)operator_new(0x20);
  WindingTestInstance::WindingTestInstance
            (this_00,context,this->m_primitiveType,this->m_winding,(bool)(this->m_yFlip & 1));
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* WindingTest::createInstance (Context& context) const
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER);

	return new WindingTestInstance(context, m_primitiveType, m_winding, m_yFlip);
}